

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O1

int PAL_InitializeChakraCore(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  PAL_ERROR dwErrCode;
  DWORD DVar4;
  BOOL BVar5;
  DWORD DVar6;
  CPalThread *pCVar7;
  CSharedMemoryObjectManager *this;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  bool bVar11;
  rlimit64 local_48;
  CPalThread *local_38;
  CPalThread *pThread;
  
  DVar6 = 0;
  if (0 < init_count.m_val) {
    return 0;
  }
  PAL_InitializeChakraCoreCalled = true;
  local_38 = (CPalThread *)0x0;
  SetLastError(0x1f);
  iVar2 = getrlimit64(RLIMIT_STACK,&local_48);
  if ((iVar2 == 0) && (0x800000 < local_48.rlim_cur)) {
    local_48.rlim_cur = 0x800000;
    iVar2 = setrlimit64(RLIMIT_STACK,&local_48);
    if (iVar2 != 0) {
      pcVar10 = 
      "err == 0 && \"Well, the environment has a strange stack limit               and setrlimit call failed to fix that\""
      ;
      uVar9 = 0x97;
      goto LAB_001cd2be;
    }
  }
  CorUnix::CriticalSectionSubSysInitialize();
  if (init_critsec == (PCRITICAL_SECTION)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&init_critsec_mutex);
    if (init_critsec == (PCRITICAL_SECTION)0x0) {
      CorUnix::InternalInitializeCriticalSectionAndSpinCount
                ((PCRITICAL_SECTION)Initialize()::temp_critsec,0,false);
      LOCK();
      bVar11 = init_critsec == (PCRITICAL_SECTION)0x0;
      if (bVar11) {
        init_critsec = (PCRITICAL_SECTION)Initialize()::temp_critsec;
      }
      UNLOCK();
      if (!bVar11) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
        InternalDeleteCriticalSection((PCRITICAL_SECTION)Initialize()::temp_critsec);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&init_critsec_mutex);
  }
  CorUnix::InternalEnterCriticalSection(local_38,init_critsec);
  if (init_count.m_val == 0) {
    gPID = getpid();
    BVar5 = TLSInitialize();
    bVar11 = true;
    if (((BVar5 != 0) && (BVar5 = MiscInitialize(), BVar5 != 0)) &&
       (BVar5 = DBG_init_channels(), BVar5 != 0)) {
      uVar3 = getpagesize();
      if (uVar3 != 0x1000) {
        fprintf(_stderr,"] %s %s:%d","Initialize",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
                ,0xd6);
        fprintf(_stderr,
                "VIRTUAL_PAGE_SIZE is incorrect for this system!\nChange include/pal/virtual.h and clr/src/inc/stdmacros.h to reflect the correct page size of %d.\n"
                ,(ulong)uVar3);
      }
      BVar5 = SHMInitialize();
      if (BVar5 != 0) {
        dwErrCode = CorUnix::InitializeProcessData();
        if ((dwErrCode == 0) && (dwErrCode = CorUnix::CreateThreadData(&local_38), dwErrCode == 0))
        {
          CorUnix::PROCAddThread(local_38,local_38);
          g_fThreadDataAvailable = 1;
          BVar5 = LOADInitializeModules();
          if (BVar5 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
            dwErrCode = 0x54f;
          }
          else {
            this = CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>();
            if (this == (CSharedMemoryObjectManager *)0x0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
              dwErrCode = 0xe;
            }
            else {
              dwErrCode = CorUnix::CSharedMemoryObjectManager::Initialize(this);
              if (dwErrCode == 0) {
                CorUnix::g_pObjectManager = this;
                CorUnix::g_pSynchronizationManager =
                     CorUnix::CPalSynchMgrController::CreatePalSynchronizationManager();
                bVar11 = true;
                if (CorUnix::g_pSynchronizationManager != (IPalSynchronizationManager *)0x0)
                goto LAB_001ccef8;
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
                dwErrCode = 8;
              }
              else {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
                (**(code **)(*(long *)this + 0x40))(this);
                CorUnix::InternalFree(this);
              }
            }
          }
        }
        else if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
        bVar11 = true;
        goto LAB_001cd019;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
      dwErrCode = 0x1f;
      bVar11 = true;
      goto LAB_001cd01e;
    }
    bVar1 = false;
  }
  else {
    pCVar7 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pCVar7 == (CPalThread *)0x0) {
      pCVar7 = CreateCurrentThreadData();
    }
    bVar11 = false;
    local_38 = pCVar7;
LAB_001ccef8:
    if (init_count.m_val == 0) {
      dwErrCode = CorUnix::CreateInitialProcessAndThreadObjects(local_38);
      if (dwErrCode == 0) {
        BVar5 = SEHInitializeSignals();
        if (BVar5 != 0) {
          BVar5 = TIMEInitialize();
          if ((BVar5 == 0) || (BVar5 = MAPInitialize(), BVar5 == 0)) {
            dwErrCode = 0x1f;
            goto LAB_001cd009;
          }
          BVar5 = FILEInitStdHandles();
          if (BVar5 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
          }
          else {
            BVar5 = CRTInitStdStreams();
            if (BVar5 != 0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
              init_count.m_val = init_count.m_val + 1;
              bVar1 = true;
              dwErrCode = 0;
              goto LAB_001cd02c;
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
            FILECleanupStdHandles();
          }
          VIRTUALCleanup();
          MAPCleanup();
          dwErrCode = 0x1f;
        }
      }
      else {
LAB_001cd009:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
      }
      PROCCleanupInitialProcess();
LAB_001cd019:
      SHMCleanup();
LAB_001cd01e:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
      bVar1 = false;
    }
    else {
      init_count.m_val = init_count.m_val + 1;
      dwErrCode = 0;
      PAL_Enter(PAL_BoundaryTop);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
      bVar1 = true;
    }
LAB_001cd02c:
    SetLastError(dwErrCode);
  }
  CorUnix::InternalLeaveCriticalSection(local_38,init_critsec);
  if (((bVar1) && (bVar11)) && (local_38 == (CPalThread *)0x0)) {
    pcVar10 = "__null != pThread";
    uVar9 = 0x1a7;
LAB_001cd2be:
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
            ,uVar9,pcVar10,"");
    fflush(_stderr);
    abort();
  }
  if ((!bVar1) && (DVar4 = GetLastError(), DVar4 == 0)) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
            ,0x1ac);
    fprintf(_stderr,"returning failure, but last error not set\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (bVar1) {
      BVar5 = VIRTUALInitialize();
      if (BVar5 == 0) {
        DVar6 = 0x1f;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001cd261;
      }
      else {
        LOCK();
        iVar2 = g_chakraCoreInitialized.m_val + 1;
        UNLOCK();
        iVar8 = g_chakraCoreInitialized.m_val + 1;
        g_chakraCoreInitialized.m_val = iVar2;
        if (1 < iVar8) {
          DVar6 = 0;
          PAL_Enter(PAL_BoundaryTop);
        }
      }
    }
    else {
      DVar6 = GetLastError();
    }
    return DVar6;
  }
LAB_001cd261:
  abort();
}

Assistant:

int
PALAPI
PAL_InitializeChakraCore()
{
    // this is not thread safe but PAL_InitializeChakraCore is per process
    // besides, calling Jsrt initializer function is thread safe
    if (init_count > 0) return ERROR_SUCCESS;
#if defined(ENABLE_CC_XPLAT_TRACE) || defined(DEBUG)
    PAL_InitializeChakraCoreCalled = true;
#endif

    if (Initialize())
    {
        return GetLastError();
    }

    if (FALSE == VIRTUALInitialize())
    {
        ERROR("Unable to initialize virtual memory support\n");
        return ERROR_GEN_FAILURE;
    }

    // Check for a repeated call (this is a no-op).
    if (InterlockedIncrement(&g_chakraCoreInitialized) > 1)
    {
        PAL_Enter(PAL_BoundaryTop);
        return ERROR_SUCCESS;
    }

    return ERROR_SUCCESS;
}